

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall
libtorrent::dht::node::verify_token
          (node *this,string_view token,sha1_hash *info_hash,endpoint *addr)

{
  dht_observer *pdVar1;
  span<const_char> data;
  span<const_char> data_00;
  undefined8 uVar2;
  bool bVar3;
  span<const_char> data_01;
  span<const_char> data_02;
  span<const_char> data_03;
  span<const_char> data_04;
  hasher h2;
  hasher h1;
  sha1_hash h;
  string address;
  hasher hStack_88;
  hasher local_80;
  address local_78;
  string local_58;
  sha1_hash local_34;
  
  if (token._M_len == 4) {
    lcrypto::hasher::hasher(&local_80);
    bVar3 = (addr->impl_).data_.base.sa_family != 2;
    if (bVar3) {
      local_78.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
      local_78.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(addr->impl_).data_ + 0x10);
      local_78.ipv6_address_.scope_id_ = (unsigned_long)(addr->impl_).data_.v6.sin6_scope_id;
      local_78.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_78.ipv4_address_.addr_.s_addr = (in4_addr_type)(addr->impl_).data_.v6.sin6_flowinfo;
      local_78.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_78.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_78.ipv6_address_.scope_id_ = 0;
    }
    local_78.type_ = (uint)bVar3;
    boost::asio::ip::address::to_string_abi_cxx11_(&local_58,&local_78);
    data.m_len = local_58._M_string_length;
    data.m_ptr = local_58._M_dataplus._M_p;
    lcrypto::hasher::update(&local_80,data);
    data_01.m_len = 4;
    data_01.m_ptr = this->m_secret[0]._M_elems;
    lcrypto::hasher::update(&local_80,data_01);
    data_02.m_len = 0x14;
    data_02.m_ptr = (char *)info_hash;
    lcrypto::hasher::update(&local_80,data_02);
    lcrypto::hasher::final((sha1_hash *)&local_78,&local_80);
    if (*(anon_enum_32 *)token._M_str == local_78.type_) {
      bVar3 = true;
    }
    else {
      lcrypto::hasher::hasher(&hStack_88);
      data_00.m_len = local_58._M_string_length;
      data_00.m_ptr = local_58._M_dataplus._M_p;
      lcrypto::hasher::update(&hStack_88,data_00);
      data_03.m_len = 4;
      data_03.m_ptr = this->m_secret[1]._M_elems;
      lcrypto::hasher::update(&hStack_88,data_03);
      data_04.m_len = 0x14;
      data_04.m_ptr = (char *)info_hash;
      lcrypto::hasher::update(&hStack_88,data_04);
      lcrypto::hasher::final(&local_34,&hStack_88);
      local_78.ipv6_address_.addr_.__in6_u.__u6_addr32[2] = local_34.m_number._M_elems[4];
      local_78.type_ = local_34.m_number._M_elems[0];
      local_78.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(in4_addr_type)local_34.m_number._M_elems[1];
      uVar2 = local_78._0_8_;
      local_78.ipv6_address_.addr_.__in6_u.__u6_addr32[0] = local_34.m_number._M_elems[2];
      local_78.ipv6_address_.addr_.__in6_u.__u6_addr32[1] = local_34.m_number._M_elems[3];
      local_78.type_ = local_34.m_number._M_elems[0];
      bVar3 = *(anon_enum_32 *)token._M_str == local_78.type_;
      local_78._0_8_ = uVar2;
      lcrypto::hasher::~hasher(&hStack_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    lcrypto::hasher::~hasher(&local_80);
  }
  else {
    pdVar1 = this->m_observer;
    if (pdVar1 == (dht_observer *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"token of incorrect length: %d",token._M_len);
    }
  }
  return bVar3;
}

Assistant:

bool node::verify_token(string_view token, sha1_hash const& info_hash
	, udp::endpoint const& addr) const
{
	if (token.length() != write_token_size)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (m_observer != nullptr)
		{
			m_observer->log(dht_logger::node, "token of incorrect length: %d"
				, int(token.length()));
		}
#endif
		return false;
	}

	hasher h1;
	std::string const address = addr.address().to_string();
	h1.update(address);
	h1.update(m_secret[0]);
	h1.update(info_hash);

	sha1_hash h = h1.final();
	if (std::equal(token.begin(), token.end(), reinterpret_cast<char*>(&h[0])))
		return true;

	hasher h2;
	h2.update(address);
	h2.update(m_secret[1]);
	h2.update(info_hash);
	h = h2.final();
	return std::equal(token.begin(), token.end(), reinterpret_cast<char*>(&h[0]));
}